

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O3

int main(void)

{
  lrtr_ip_addr *plVar1;
  int iVar2;
  pfx_record *ppVar3;
  uint uVar4;
  uint8_t max_mask_len;
  pfxv_state *ppVar5;
  long lVar6;
  long in_FS_OFFSET;
  uint len;
  pfx_table pfxt;
  pfxv_state res;
  pfx_record pfx;
  trie_node **local_168;
  uint local_15c;
  undefined1 local_158 [80];
  pfx_record local_108;
  undefined1 local_d0 [16];
  code *local_c0;
  pthread_rwlock_t local_b8;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  pthread_rwlock_t local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pfx_table_init((pfx_table *)local_158,(pfx_update_fp)0x0);
  plVar1 = (lrtr_ip_addr *)(local_80 + 4);
  local_80 = (undefined1  [8])0x7b;
  lrtr_ip_str_to_addr("10.10.0.0",plVar1);
  local_68.__size[0] = '\x10';
  local_68.__size[1] = '\x18';
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xcb,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x7b,"10.10.0.0",'\x10',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_158,0x7c,"10.10.0.0",'\x10',BGP_PFXV_STATE_INVALID);
  validate((pfx_table *)local_158,0x7b,"10.10.0.0",'\x18',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_158,0x7b,"10.10.10.0",'\x14',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_158,0x7b,"10.10.10.0",'\x19',BGP_PFXV_STATE_INVALID);
  validate((pfx_table *)local_158,0x7b,"10.11.10.0",'\x10',BGP_PFXV_STATE_NOT_FOUND);
  lrtr_ip_str_to_addr("10.10.0.0",plVar1);
  local_80._0_4_ = 0x7a;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xd6,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x7a,"10.10.0.0",'\x12',BGP_PFXV_STATE_VALID);
  lrtr_ip_str_to_addr("11.10.0.0",plVar1);
  local_80._0_4_ = 0x16;
  local_68.__size[0] = '\x11';
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xdc,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x16,"11.10.0.0",'\x11',BGP_PFXV_STATE_VALID);
  lrtr_ip_str_to_addr("2a01:4f8:131::",plVar1);
  local_68.__size[0] = '0';
  local_68.__size[1] = '0';
  local_80 = (undefined1  [8])0x10000007c;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xe4,"void pfx_table_test(void)");
  }
  iVar2 = pfx_table_validate((pfx_table *)local_158,0x7c,plVar1,'0',(pfxv_state *)local_d0);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_validate(&pfxt, 124, &pfx.prefix, 48, &res) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xe5,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x7c,"2a01:4f8:131::",'0',BGP_PFXV_STATE_VALID);
  validate((pfx_table *)local_158,0x7c,"2a01:4f8:131:15::",'8',BGP_PFXV_STATE_INVALID);
  iVar2 = lrtr_ip_str_to_addr("1.0.4.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.0.4.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xea,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x16';
  local_68.__size[1] = '\x16';
  local_80._0_4_ = 0xdb8b;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xee,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,local_80._0_4_,"1.0.4.0",local_68.__size[0],BGP_PFXV_STATE_VALID);
  iVar2 = lrtr_ip_str_to_addr("1.8.1.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.8.1.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf1,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x18';
  local_68.__size[1] = '\x18';
  local_80._0_4_ = 0x95c9;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf5,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,local_80._0_4_,"1.8.1.0",local_68.__size[0],BGP_PFXV_STATE_VALID);
  iVar2 = lrtr_ip_str_to_addr("1.8.8.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.8.8.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xf8,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x18';
  local_68.__size[1] = '\x18';
  local_80._0_4_ = 0x95c9;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0xfc,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,local_80._0_4_,"1.8.8.0",local_68.__size[0],BGP_PFXV_STATE_VALID);
  pfx_table_free((pfx_table *)local_158);
  iVar2 = lrtr_ip_str_to_addr("1.0.65.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"1.0.65.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x100,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x12';
  local_68.__size[1] = '\x12';
  local_80._0_4_ = 0x46e0;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x104,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,local_80._0_4_,"1.0.65.0",local_68.__size[0],BGP_PFXV_STATE_VALID)
  ;
  pfx_table_free((pfx_table *)local_158);
  iVar2 = lrtr_ip_str_to_addr("10.0.0.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x108,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x10';
  local_68.__size[1] = '\x10';
  local_80._0_4_ = 0x7b;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x10c,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,local_80._0_4_,"10.0.0.0",local_68.__size[0],BGP_PFXV_STATE_VALID)
  ;
  validate((pfx_table *)local_158,0x7c,"10.0.5.0",'\x18',BGP_PFXV_STATE_INVALID);
  pfx_table_free((pfx_table *)local_158);
  iVar2 = lrtr_ip_str_to_addr("109.105.96.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"109.105.96.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x111,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x13';
  local_68.__size[1] = '\x13';
  local_80._0_4_ = 0x7b;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x115,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x1c8,"109.105.128.0",'\x14',BGP_PFXV_STATE_NOT_FOUND);
  pfx_table_free((pfx_table *)local_158);
  iVar2 = lrtr_ip_str_to_addr("190.57.224.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"190.57.224.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x119,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x13';
  local_68.__size[1] = '\x18';
  local_80._0_4_ = 0x7b;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x11d,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x7b,"190.57.72.0",'\x15',BGP_PFXV_STATE_NOT_FOUND);
  pfx_table_free((pfx_table *)local_158);
  iVar2 = lrtr_ip_str_to_addr("80.253.128.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"80.253.128.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x121,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x13';
  local_68.__size[1] = '\x13';
  local_80._0_4_ = 0x7b;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x125,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x7b,"80.253.144.0",'\x14',BGP_PFXV_STATE_INVALID);
  iVar2 = lrtr_ip_str_to_addr("10.10.0.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.10.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x128,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x10';
  local_68.__size[1] = '\x10';
  local_80._0_4_ = 0;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,300,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x7b,"10.10.0.0",'\x10',BGP_PFXV_STATE_INVALID);
  iVar2 = lrtr_ip_str_to_addr("10.0.0.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x12f,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\b';
  local_68.__size[1] = '\x0f';
  local_80._0_4_ = 6;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x133,"void pfx_table_test(void)");
  }
  iVar2 = lrtr_ip_str_to_addr("10.0.0.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.0.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x135,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\b';
  local_68.__size[1] = '\x0f';
  local_80._0_4_ = 5;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x139,"void pfx_table_test(void)");
  }
  iVar2 = lrtr_ip_str_to_addr("10.1.0.0",plVar1);
  if (iVar2 != 0) {
    __assert_fail("lrtr_ip_str_to_addr(\"10.1.0.0\", &pfx.prefix) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x13b,"void pfx_table_test(void)");
  }
  local_68.__size[0] = '\x10';
  local_68.__size[1] = '\x10';
  local_80._0_4_ = 5;
  iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x13f,"void pfx_table_test(void)");
  }
  validate((pfx_table *)local_158,0x7b,"10.1.0.0",'\x10',BGP_PFXV_STATE_INVALID);
  pfx_table_free((pfx_table *)local_158);
  printf("%s() successful\n");
  pfx_table_init((pfx_table *)local_80,(pfx_update_fp)0x0);
  plVar1 = (lrtr_ip_addr *)(local_d0 + 4);
  local_b8.__size[0] = ' ';
  local_b8.__size[1] = ' ';
  local_d0._0_4_ = 0x50;
  local_b8._8_8_ = (rtr_socket *)local_158;
  lrtr_ip_str_to_addr("10.11.10.0",plVar1);
  iVar2 = pfx_table_add((pfx_table *)local_80,(pfx_record *)local_d0);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x39,"void remove_src_test(void)");
  }
  local_d0._0_4_ = 0x5a;
  local_b8._8_8_ = (rtr_socket *)0x0;
  lrtr_ip_str_to_addr("10.11.10.0",plVar1);
  iVar2 = pfx_table_add((pfx_table *)local_80,(pfx_record *)local_d0);
  if (iVar2 != 0) {
    __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x3e,"void remove_src_test(void)");
  }
  local_b8._8_8_ = (rtr_socket *)0x0;
  local_b8.__size[0] = '\x18';
  lrtr_ip_str_to_addr("192.168.0.0",plVar1);
  iVar2 = pfx_table_add((pfx_table *)local_80,(pfx_record *)local_d0);
  if (iVar2 == 0) {
    local_b8.__size[0] = '\b';
    local_b8._8_8_ = (rtr_socket *)local_158;
    lrtr_ip_str_to_addr("10.0.0.0",plVar1);
    iVar2 = pfx_table_add((pfx_table *)local_80,(pfx_record *)local_d0);
    if (iVar2 != 0) {
      __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x48,"void remove_src_test(void)");
    }
    local_15c = 0;
    local_168 = (trie_node **)0x0;
    iVar2 = trie_get_children((trie_node *)local_80,&local_168,&local_15c);
    if (iVar2 == -1) {
      __assert_fail("trie_get_children(pfxt.ipv4, &array, &len) != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x4d,"void remove_src_test(void)");
    }
    free(local_168);
    local_168 = (trie_node **)0x0;
    if (local_15c != 2) {
      __assert_fail("(len + 1) == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x50,"void remove_src_test(void)");
    }
    pfx_table_src_remove((pfx_table *)local_80,(rtr_socket *)local_158);
    local_15c = 0;
    iVar2 = trie_get_children((trie_node *)local_80,&local_168,&local_15c);
    if (iVar2 == -1) {
      __assert_fail("trie_get_children(pfxt.ipv4, &array, &len) != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x55,"void remove_src_test(void)");
    }
    free(local_168);
    if (local_15c != 1) {
      __assert_fail("(len + 1) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                    ,0x57,"void remove_src_test(void)");
    }
    validate((pfx_table *)local_80,0x5a,"10.0.0.0",'\b',BGP_PFXV_STATE_NOT_FOUND);
    validate((pfx_table *)local_80,0x5a,"10.11.10.0",' ',BGP_PFXV_STATE_VALID);
    validate((pfx_table *)local_80,0x50,"10.11.10.0",' ',BGP_PFXV_STATE_INVALID);
    pfx_table_free((pfx_table *)local_80);
    printf("%s() successful\n");
    pfx_table_init((pfx_table *)local_158,(pfx_update_fp)0x0);
    printf("Inserting %u records\n",0x2ffd0);
    uVar4 = 0xfffffff0;
    plVar1 = (lrtr_ip_addr *)(local_80 + 4);
    do {
      local_68.__size[0] = ' ';
      local_68.__size[1] = ' ';
      local_68._8_8_ = (rtr_socket *)0x0;
      local_78._0_4_ =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      local_80._4_4_ = 0;
      local_80._0_4_ = uVar4;
      iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x7b,"void mass_test(void)");
      }
      local_80._0_4_ = uVar4 + 1;
      iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x7e,"void mass_test(void)");
      }
      local_68.__size[0] = 0x80;
      local_68.__size[1] = 0x80;
      local_80._4_4_ = 1;
      local_78._8_4_ = 0xfffffff0;
      local_78._0_4_ = uVar4 - 0x10000;
      iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)local_80);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x85,"void mass_test(void)");
      }
      uVar4 = uVar4 - 1;
    } while (0xfffeffff < uVar4);
    puts("validating..");
    uVar4 = 0xfffffff0;
    do {
      local_68.__size[0] = ' ';
      local_68.__size[1] = ' ';
      local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff);
      local_78._0_4_ =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      iVar2 = pfx_table_validate((pfx_table *)local_158,uVar4,plVar1,' ',(pfxv_state *)local_d0);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_validate(&pfxt, i, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x8f,"void mass_test(void)");
      }
      if (local_d0._0_4_ != BGP_PFXV_STATE_VALID) {
        __assert_fail("res == BGP_PFXV_STATE_VALID",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x90,"void mass_test(void)");
      }
      iVar2 = pfx_table_validate((pfx_table *)local_158,uVar4 + 1,plVar1,local_68.__size[0],
                                 (pfxv_state *)local_d0);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x91,"void mass_test(void)");
      }
      if (local_d0._0_4_ != BGP_PFXV_STATE_VALID) {
        __assert_fail("res == BGP_PFXV_STATE_VALID",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x92,"void mass_test(void)");
      }
      local_68.__size[0] = 0x80;
      local_68.__size[1] = 0x80;
      local_80._4_4_ = 1;
      local_78._8_4_ = 0xfffffff0;
      local_78._0_4_ = uVar4 - 0x10000;
      ppVar5 = (pfxv_state *)local_d0;
      iVar2 = pfx_table_validate((pfx_table *)local_158,uVar4 + 1,plVar1,0x80,(pfxv_state *)local_d0
                                );
      if (iVar2 != 0) {
        __assert_fail("pfx_table_validate(&pfxt, i + 1, &pfx.prefix, pfx.min_len, &res) == PFX_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x9a,"void mass_test(void)");
      }
      if (local_d0._0_4_ != BGP_PFXV_STATE_VALID) {
        __assert_fail("res == BGP_PFXV_STATE_VALID",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x9b,"void mass_test(void)");
      }
      uVar4 = uVar4 - 1;
    } while (0xfffeffff < uVar4);
    puts("removing records");
    uVar4 = 0xfffffff0;
    do {
      local_68._8_8_ = (rtr_socket *)0x0;
      local_68.__size[0] = ' ';
      local_68.__size[1] = ' ';
      local_80._4_4_ = 0;
      local_80._0_4_ = uVar4;
      local_78._0_4_ =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      iVar2 = pfx_table_remove((pfx_table *)local_158,(pfx_record *)local_80);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0xa7,"void mass_test(void)");
      }
      local_80._0_4_ = uVar4 + 1;
      iVar2 = pfx_table_remove((pfx_table *)local_158,(pfx_record *)local_80);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0xaa,"void mass_test(void)");
      }
      local_80._4_4_ = LRTR_IPV6;
      local_68.__size[0] = 0x80;
      local_68.__size[1] = 0x80;
      local_78._8_4_ = 0xfffffff0;
      local_78._0_4_ = uVar4 - 0x10000;
      iVar2 = pfx_table_remove((pfx_table *)local_158,(pfx_record *)local_80);
      max_mask_len = (uint8_t)ppVar5;
      if (iVar2 != 0) {
        __assert_fail("pfx_table_remove(&pfxt, &pfx) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0xb1,"void mass_test(void)");
      }
      uVar4 = uVar4 - 1;
    } while (0xfffeffff < uVar4);
    pfx_table_free((pfx_table *)local_158);
    lVar6 = 0;
    printf("%s() successful\n");
    pfx_table_init((pfx_table *)local_158,(pfx_update_fp)0x0);
    add_ip4_pfx_record((pfx_table *)local_158,200,"10.100.255.0",'\x18',max_mask_len);
    add_ip4_pfx_record((pfx_table *)local_158,300,"255.0.0.0",'\x18',max_mask_len);
    add_ip4_pfx_record((pfx_table *)local_158,400,"128.0.0.0",'\x01',max_mask_len);
    validate((pfx_table *)local_158,400,"255.0.0.0",'\x18',BGP_PFXV_STATE_VALID);
    pfx_table_free((pfx_table *)local_158);
    ppVar3 = (pfx_record *)calloc(6,0x28);
    pfx_table_init((pfx_table *)local_158,(pfx_update_fp)0x0);
    create_ip4_pfx_record(ppVar3,1,"89.18.183.0",'\x18','\x18');
    create_ip4_pfx_record(ppVar3 + 1,2,"109.164.0.0",'\x11','\x19');
    create_ip4_pfx_record(ppVar3 + 2,3,"185.131.60.0",'\x16','\x18');
    create_ip4_pfx_record(ppVar3 + 3,4,"185.146.28.0",'\x16','\x16');
    create_ip4_pfx_record(ppVar3 + 4,5,"212.5.51.0",'\x18','\x18');
    create_ip4_pfx_record(ppVar3 + 5,6,"213.175.86.0",'\x18','\x18');
    do {
      iVar2 = pfx_table_add((pfx_table *)local_158,(pfx_record *)((long)&ppVar3->asn + lVar6));
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt, &records[i]) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x17c,"void test_issue152(void)");
      }
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    lVar6 = 0;
    do {
      iVar2 = pfx_table_remove((pfx_table *)local_158,(pfx_record *)((long)&ppVar3->asn + lVar6));
      if (iVar2 != 0) {
        __assert_fail("pfx_table_remove(&pfxt, &records[i]) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x17f,"void test_issue152(void)");
      }
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    free(ppVar3);
    pfx_table_init((pfx_table *)local_80,(pfx_update_fp)0x0);
    pfx_table_init((pfx_table *)local_d0,(pfx_update_fp)0x0);
    create_ip4_pfx_record((pfx_record *)local_158,1,"1.1.1.1",'\x18','\x18');
    ppVar3 = (pfx_record *)(local_158 + 0x28);
    create_ip4_pfx_record(ppVar3,2,"2.2.2.2",'\x18','\x18');
    create_ip4_pfx_record(&local_108,3,"3.3.3.3",'\x18','\x18');
    puts("Adding to table one");
    iVar2 = pfx_table_add((pfx_table *)local_80,(pfx_record *)local_158);
    if (iVar2 == 0) {
      iVar2 = pfx_table_add((pfx_table *)local_80,ppVar3);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt1, &records[1]) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x1a6,"void test_pfx_merge(void)");
      }
      puts("Adding to table two");
      iVar2 = pfx_table_add((pfx_table *)local_d0,ppVar3);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt2, &records[1]) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x1a8,"void test_pfx_merge(void)");
      }
      iVar2 = pfx_table_add((pfx_table *)local_d0,&local_108);
      if (iVar2 != 0) {
        __assert_fail("pfx_table_add(&pfxt2, &records[2]) == PFX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                      ,0x1a9,"void test_pfx_merge(void)");
      }
      puts("Computing diff");
      local_78._8_8_ = update_cb1;
      local_c0 = update_cb1;
      pfx_table_notify_diff((pfx_table *)local_d0,(pfx_table *)local_80,(rtr_socket *)0x1);
      local_78._8_8_ = 0;
      local_c0 = (code *)0x0;
      puts("Freeing table one");
      pfx_table_free((pfx_table *)local_80);
      puts("Freeing table two");
      pfx_table_free((pfx_table *)local_d0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return 0;
      }
      __stack_chk_fail();
    }
    __assert_fail("pfx_table_add(&pfxt1, &records[0]) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x1a5,"void test_pfx_merge(void)");
  }
  __assert_fail("pfx_table_add(&pfxt, &pfx) == PFX_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                ,0x43,"void remove_src_test(void)");
}

Assistant:

int main(void)
{
	pfx_table_test();
	remove_src_test();
	mass_test();
	test_issue99();
	test_issue152();
	test_pfx_merge();

	return EXIT_SUCCESS;
}